

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zesEngineGetActivity(zes_engine_handle_t hEngine,zes_engine_stats_t *pStats)

{
  zes_pfnEngineGetActivity_t pfnGetActivity;
  dditable_t *dditable;
  ze_result_t result;
  zes_engine_stats_t *pStats_local;
  zes_engine_handle_t hEngine_local;
  
  if (*(code **)(*(long *)(hEngine + 8) + 0xb68) == (code *)0x0) {
    hEngine_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hEngine_local._4_4_ =
         (**(code **)(*(long *)(hEngine + 8) + 0xb68))(*(undefined8 *)hEngine,pStats);
  }
  return hEngine_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesEngineGetActivity(
        zes_engine_handle_t hEngine,                    ///< [in] Handle for the component.
        zes_engine_stats_t* pStats                      ///< [in,out] Will contain a snapshot of the engine group activity
                                                        ///< counters.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_engine_object_t*>( hEngine )->dditable;
        auto pfnGetActivity = dditable->zes.Engine.pfnGetActivity;
        if( nullptr == pfnGetActivity )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hEngine = reinterpret_cast<zes_engine_object_t*>( hEngine )->handle;

        // forward to device-driver
        result = pfnGetActivity( hEngine, pStats );

        return result;
    }